

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::AddFacesFromNodeSet
          (ChContactSurfaceNodeCloud *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
          *node_set,double point_radius)

{
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> mnodeFEArot;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnodeFEA;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((this->super_ChContactSurface).m_mesh != (ChMesh *)0x0) {
    for (uVar2 = 0;
        (ulong)uVar2 <
        (ulong)((long)(node_set->
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(node_set->
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4); uVar2 = uVar2 + 1) {
      std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyz,chrono::fea::ChNodeFEAbase>
                ((shared_ptr<chrono::fea::ChNodeFEAbase> *)&local_60);
      if (local_60._M_ptr == (element_type *)0x0) {
        std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzrot,chrono::fea::ChNodeFEAbase>
                  ((shared_ptr<chrono::fea::ChNodeFEAbase> *)&local_70);
        if (local_70._M_ptr != (element_type *)0x0) {
          std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_50,&local_70);
          AddNode(this,(shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_50,point_radius);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        }
        p_Var1 = &local_70;
      }
      else {
        std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)&local_40,
                   &local_60);
        AddNode(this,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)&local_40,point_radius);
        p_Var1 = &local_40;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    }
  }
  return;
}

Assistant:

void ChContactSurfaceNodeCloud::AddFacesFromNodeSet(std::vector<std::shared_ptr<ChNodeFEAbase> >& node_set,
                                                    const double point_radius) {
    if (!m_mesh)
        return;
    for (unsigned int i = 0; i < node_set.size(); ++i)
        if (auto mnodeFEA = std::dynamic_pointer_cast<ChNodeFEAxyz>(node_set[i]))
            this->AddNode(mnodeFEA, point_radius);
        else if (auto mnodeFEArot = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(node_set[i]))
            this->AddNode(mnodeFEArot, point_radius);
}